

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# clipper.cpp
# Opt level: O0

bool ClipperLib::Orientation(Polygon *poly)

{
  long lVar1;
  size_type sVar2;
  const_reference pvVar3;
  long lVar4;
  long64 lVar5;
  undefined8 *puVar6;
  Int128 local_d0;
  Int128 local_c0;
  Int128 local_b0;
  Int128 local_a0;
  Int128 local_90;
  Int128 local_80;
  Int128 local_70;
  undefined1 local_60 [8];
  Int128 cross;
  IntPoint vec2;
  IntPoint vec1;
  int local_28;
  int i;
  int jminus;
  int jplus;
  int j;
  int highI;
  Polygon *poly_local;
  
  sVar2 = std::vector<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>::size(poly);
  local_28 = (int)sVar2 + -1;
  if (local_28 < 2) {
    poly_local._7_1_ = false;
  }
  else {
    jminus = 0;
    for (vec1.Y._4_4_ = 0; vec1.Y._4_4_ <= local_28; vec1.Y._4_4_ = vec1.Y._4_4_ + 1) {
      pvVar3 = std::vector<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>::operator[]
                         (poly,(long)vec1.Y._4_4_);
      lVar4 = pvVar3->Y;
      pvVar3 = std::vector<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>::operator[]
                         (poly,(long)jminus);
      if (pvVar3->Y <= lVar4) {
        pvVar3 = std::vector<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>::
                 operator[](poly,(long)vec1.Y._4_4_);
        lVar4 = pvVar3->Y;
        pvVar3 = std::vector<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>::
                 operator[](poly,(long)jminus);
        if (lVar4 <= pvVar3->Y) {
          pvVar3 = std::vector<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>::
                   operator[](poly,(long)vec1.Y._4_4_);
          lVar4 = pvVar3->X;
          pvVar3 = std::vector<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>::
                   operator[](poly,(long)jminus);
          if (pvVar3->X <= lVar4) goto LAB_00b972ee;
        }
        jminus = vec1.Y._4_4_;
      }
LAB_00b972ee:
    }
    if (jminus == local_28) {
      i = 0;
    }
    else {
      i = jminus + 1;
    }
    if (jminus != 0) {
      local_28 = jminus + -1;
    }
    IntPoint::IntPoint((IntPoint *)&vec2.Y,0,0);
    IntPoint::IntPoint((IntPoint *)&cross.lo,0,0);
    pvVar3 = std::vector<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>::operator[]
                       (poly,(long)jminus);
    lVar4 = pvVar3->X;
    pvVar3 = std::vector<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>::operator[]
                       (poly,(long)local_28);
    vec2.Y = lVar4 - pvVar3->X;
    pvVar3 = std::vector<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>::operator[]
                       (poly,(long)jminus);
    lVar4 = pvVar3->Y;
    pvVar3 = std::vector<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>::operator[]
                       (poly,(long)local_28);
    lVar4 = lVar4 - pvVar3->Y;
    pvVar3 = std::vector<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>::operator[]
                       (poly,(long)i);
    lVar1 = pvVar3->X;
    pvVar3 = std::vector<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>::operator[]
                       (poly,(long)jminus);
    cross.lo = lVar1 - pvVar3->X;
    pvVar3 = std::vector<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>::operator[]
                       (poly,(long)i);
    lVar1 = pvVar3->Y;
    pvVar3 = std::vector<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>::operator[]
                       (poly,(long)jminus);
    vec2.X = lVar1 - pvVar3->Y;
    lVar5 = Abs(vec2.Y);
    if ((((lVar5 < 0x40000000) && (lVar5 = Abs(lVar4), lVar5 < 0x40000000)) &&
        (lVar5 = Abs(cross.lo), lVar5 < 0x40000000)) && (lVar5 = Abs(vec2.X), lVar5 < 0x40000000)) {
      poly_local._7_1_ = -1 < vec2.Y * vec2.X - cross.lo * lVar4;
    }
    else {
      lVar5 = Abs(vec2.Y);
      if (((0x3fffffffffffffff < lVar5) || (lVar5 = Abs(lVar4), 0x3fffffffffffffff < lVar5)) ||
         ((lVar5 = Abs(cross.lo), 0x3fffffffffffffff < lVar5 ||
          (lVar5 = Abs(vec2.X), 0x3fffffffffffffff < lVar5)))) {
        puVar6 = (undefined8 *)__cxa_allocate_exception(8);
        *puVar6 = "Coordinate exceeds range bounds.";
        __cxa_throw(puVar6,&char_const*::typeinfo,0);
      }
      Int128::Int128(&local_80,vec2.Y);
      Int128::Int128(&local_90,vec2.X);
      Int128::operator*(&local_70,&local_80);
      Int128::Int128(&local_b0,cross.lo);
      Int128::Int128(&local_c0,lVar4);
      Int128::operator*(&local_a0,&local_b0);
      Int128::operator-((Int128 *)local_60,&local_70);
      Int128::Int128(&local_d0,0);
      poly_local._7_1_ = Int128::operator>=((Int128 *)local_60,&local_d0);
    }
  }
  return poly_local._7_1_;
}

Assistant:

bool Orientation(const Polygon &poly)
{
  int highI = (int)poly.size() -1;
  if (highI < 2) return false;

  int j = 0, jplus, jminus;
  for (int i = 0; i <= highI; ++i)
  {
    if (poly[i].Y < poly[j].Y) continue;
    if ((poly[i].Y > poly[j].Y || poly[i].X < poly[j].X)) j = i;
  };
  if (j == highI) jplus = 0;
  else jplus = j +1;
  if (j == 0) jminus = highI;
  else jminus = j -1;

  IntPoint vec1, vec2;
  //get cross product of vectors of the edges adjacent to highest point ...
  vec1.X = poly[j].X - poly[jminus].X;
  vec1.Y = poly[j].Y - poly[jminus].Y;
  vec2.X = poly[jplus].X - poly[j].X;
  vec2.Y = poly[jplus].Y - poly[j].Y;

  if (Abs(vec1.X) > loRange || Abs(vec1.Y) > loRange ||
    Abs(vec2.X) > loRange || Abs(vec2.Y) > loRange)
  {
    if (Abs(vec1.X) > hiRange || Abs(vec1.Y) > hiRange ||
      Abs(vec2.X) > hiRange || Abs(vec2.Y) > hiRange)
        throw "Coordinate exceeds range bounds.";
    Int128 cross = Int128(vec1.X) * Int128(vec2.Y) -
      Int128(vec2.X) * Int128(vec1.Y);
    return cross >= 0;
  }
  else
    return (vec1.X * vec2.Y - vec2.X * vec1.Y) >= 0;
}